

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  ostream *in_RDI;
  string detail_1;
  string summary_1;
  string location_1;
  string detail;
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int skips;
  int failures;
  string *in_stack_fffffffffffffd18;
  TestPartResult *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  TestResult *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  allocator<char> *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdbc;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [39];
  undefined1 local_1b9 [33];
  string local_198 [32];
  string local_178 [32];
  string local_158 [8];
  string *in_stack_fffffffffffffeb0;
  TestResult *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  TestPartResult *local_28;
  int local_1c;
  int local_18;
  int local_14;
  ostream *local_8;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_8 = in_RDI;
  while (iVar3 = local_1c, iVar2 = TestResult::total_part_count((TestResult *)0x190833),
        iVar3 < iVar2) {
    local_28 = TestResult::GetTestPartResult
                         (in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20))
    ;
    bVar1 = TestPartResult::failed(in_stack_fffffffffffffd20);
    if (bVar1) {
      local_14 = local_14 + 1;
      if ((local_14 == 1) && (local_18 == 0)) {
        std::operator<<(local_8,">\n");
      }
      TestPartResult::file_name(in_stack_fffffffffffffd20);
      TestPartResult::line_number(local_28);
      in_stack_fffffffffffffdb0 = local_48;
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((char *)CONCAT44(in_stack_fffffffffffffdbc,iVar3),
                 (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      TestPartResult::summary((TestPartResult *)0x190916);
      std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
      std::__cxx11::string::~string(local_88);
      poVar4 = std::operator<<(local_8,"      <failure message=\"");
      EscapeXmlAttribute(in_stack_fffffffffffffd18);
      poVar4 = std::operator<<(poVar4,local_b8);
      std::operator<<(poVar4,"\" type=\"\">");
      std::__cxx11::string::~string(local_b8);
      std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      TestPartResult::message((TestPartResult *)0x1909e8);
      std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
      std::__cxx11::string::~string(local_f8);
      RemoveInvalidXmlCharacters(in_stack_fffffffffffffd58);
      std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
      std::__cxx11::string::~string(local_118);
      std::operator<<(local_8,"</failure>\n");
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
    else {
      bVar1 = TestPartResult::skipped(local_28);
      if (bVar1) {
        local_18 = local_18 + 1;
        if ((local_18 == 1) && (local_14 == 0)) {
          std::operator<<(local_8,">\n");
        }
        TestPartResult::file_name(in_stack_fffffffffffffd20);
        TestPartResult::line_number(local_28);
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((char *)CONCAT44(in_stack_fffffffffffffdbc,iVar3),
                   (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
        std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        TestPartResult::summary((TestPartResult *)0x190c52);
        std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
        std::__cxx11::string::~string(local_178);
        in_stack_fffffffffffffd60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(local_8,"      <skipped message=\"");
        in_stack_fffffffffffffd50 = (allocator<char> *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffd58 = (string *)local_1b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
                   in_stack_fffffffffffffd50);
        EscapeXmlAttribute(in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd48 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)in_stack_fffffffffffffd60,local_198);
        std::operator<<((ostream *)in_stack_fffffffffffffd48,"\">");
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string((string *)(local_1b9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1b9);
        std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd40 = TestPartResult::message((TestPartResult *)0x190d6f);
        std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
        std::__cxx11::string::~string(local_200);
        RemoveInvalidXmlCharacters(in_stack_fffffffffffffd58);
        std::__cxx11::string::c_str();
        OutputXmlCDataSection
                  ((ostream *)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28);
        std::__cxx11::string::~string(local_220);
        std::operator<<(local_8,"</skipped>\n");
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_138);
      }
    }
    local_1c = local_1c + 1;
  }
  if (((local_14 == 0) && (local_18 == 0)) &&
     (iVar3 = TestResult::test_property_count((TestResult *)0x190fb0), iVar3 == 0)) {
    std::operator<<(local_8," />\n");
  }
  else {
    if ((local_14 == 0) && (local_18 == 0)) {
      std::operator<<(local_8,">\n");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50
              );
    OutputXmlTestProperties
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdbf);
    std::operator<<(local_8,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\"" << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result, /*indent=*/"      ");
    *stream << "    </testcase>\n";
  }
}